

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateFunctionCallByName
          (ExpressionContext *ctx,SynBase *source,InplaceStr name,ArrayView<ArgumentData> arguments,
          bool allowFailure,bool allowInternal,bool allowFastLookup)

{
  Lexeme *messageStart_00;
  SynBase *pSVar1;
  IntrusiveList<TypeHandle> generics_00;
  InplaceStr functionName;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<FunctionValue> functions_00;
  IntrusiveList<TypeHandle> generics_01;
  ArrayView<ArgumentData> arguments_01;
  ArrayView<unsigned_int> ratings_00;
  IntrusiveList<ExprBase> arguments_02;
  InplaceStr name_00;
  InplaceStr name_01;
  SynBase *pSVar2;
  uint uVar3;
  FunctionData *pFVar4;
  ExprBase *pEVar5;
  bool_type bVar6;
  SynBase *source_00;
  FunctionData *function_00;
  size_t sVar7;
  ExprPassthrough *this;
  ArgumentData *pAVar8;
  TypeBase *pTVar9;
  ExprError *this_00;
  TypeBase *type;
  char *end;
  ArrayView<ArgumentData> arguments_03;
  ArrayView<FunctionValue> functions_01;
  ArrayView<ArgumentData> arguments_04;
  uint local_53c;
  undefined1 auStack_538 [4];
  uint i;
  IntrusiveList<ExprBase> errorArguments;
  char *messageStart;
  ArrayView<unsigned_int> ratings;
  ArrayView<FunctionValue> functions_1;
  IntrusiveList<TypeHandle> generics;
  ExprBase *result_2;
  IntrusiveList<SynIdentifier> local_478;
  ExprBase *local_468;
  ExprBase *overloads_1;
  ExpressionContext *local_458;
  undefined8 uStack_450;
  IntrusiveList<TypeHandle> local_448;
  undefined1 local_438 [12];
  ExprBase *local_428;
  ExprBase *result_1;
  FunctionValue local_408;
  undefined1 local_3e0 [8];
  SmallArray<FunctionValue,_32U> functions;
  FunctionLookupChain function;
  ExprBase *result;
  IntrusiveList<SynIdentifier> local_88;
  ExprBase *local_78;
  ExprBase *overloads;
  TypeBase *pTStack_68;
  uint hash;
  TypeBase *nextType;
  bool allowFastLookup_local;
  bool allowInternal_local;
  SynBase *pSStack_58;
  bool allowFailure_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  ArrayView<ArgumentData> arguments_local;
  InplaceStr name_local;
  
  ctx_local = (ExpressionContext *)arguments.data;
  end = name.end;
  arguments_local._8_8_ = name.begin;
  arguments_local.data._0_4_ = arguments.count;
  nextType._7_1_ = allowFailure;
  nextType._6_1_ = allowInternal;
  nextType._5_1_ = allowFastLookup;
  pSStack_58 = source;
  source_local = (SynBase *)ctx;
  if (allowFastLookup) {
    pTStack_68 = anon_unknown.dwarf_8df1c::FindNextTypeFromScope(ctx->scope);
    if (pTStack_68 != (TypeBase *)0x0) {
      overloads._4_4_ = pTStack_68->nameHash;
      overloads._4_4_ = NULLC::StringHashContinue(overloads._4_4_,"::");
      overloads._4_4_ = NULLC::StringHashContinue(overloads._4_4_,(char *)arguments_local._8_8_,end)
      ;
      pFVar4 = anon_unknown.dwarf_8df1c::LookupFunctionByName
                         ((ExpressionContext *)source_local,overloads._4_4_);
      pSVar2 = source_local;
      pSVar1 = pSStack_58;
      if (pFVar4 != (FunctionData *)0x0) {
        IntrusiveList<SynIdentifier>::IntrusiveList(&local_88);
        name_01.end = end;
        name_01.begin = (char *)arguments_local._8_8_;
        local_78 = CreateVariableAccess
                             ((ExpressionContext *)pSVar2,pSVar1,local_88,name_01,
                              (bool)(nextType._6_1_ & 1));
        if ((local_78 != (ExprBase *)0x0) &&
           (arguments_03.count = (uint)arguments_local.data,
           arguments_03.data = (ArgumentData *)ctx_local, arguments_03._12_4_ = 0,
           pEVar5 = CreateFunctionCall((ExpressionContext *)source_local,pSStack_58,local_78,
                                       arguments_03,(bool)(nextType._7_1_ & 1)),
           pEVar5 != (ExprBase *)0x0)) {
          return pEVar5;
        }
      }
    }
    pSVar1 = source_local;
    uVar3 = InplaceStr::hash((InplaceStr *)&arguments_local.count);
    anon_unknown.dwarf_8df1c::LookupFunctionChainByName
              ((FunctionLookupChain *)&functions.allocator,(ExpressionContext *)pSVar1,uVar3);
    bVar6 = (anonymous_namespace)::FunctionLookupChain::operator_cast_to_function_pointer
                      ((FunctionLookupChain *)&functions.allocator);
    if (bVar6 != 0) {
      SmallArray<FunctionValue,_32U>::SmallArray
                ((SmallArray<FunctionValue,_32U> *)local_3e0,(Allocator *)source_local[0x229].begin)
      ;
      while (bVar6 = (anonymous_namespace)::FunctionLookupChain::operator_cast_to_function_pointer
                               ((FunctionLookupChain *)&functions.allocator), pSVar2 = source_local,
            pSVar1 = pSStack_58, bVar6 != 0) {
        pFVar4 = anon_unknown.dwarf_8df1c::FunctionLookupChain::operator*
                           ((FunctionLookupChain *)&functions.allocator);
        pSVar2 = source_local;
        source_00 = &ExpressionContext::MakeInternal((ExpressionContext *)source_local,pSStack_58)->
                     super_SynBase;
        function_00 = anon_unknown.dwarf_8df1c::FunctionLookupChain::operator*
                                ((FunctionLookupChain *)&functions.allocator);
        pEVar5 = CreateFunctionContextAccess((ExpressionContext *)pSVar2,source_00,function_00);
        FunctionValue::FunctionValue(&local_408,pSVar1,pFVar4,pEVar5);
        SmallArray<FunctionValue,_32U>::push_back
                  ((SmallArray<FunctionValue,_32U> *)local_3e0,&local_408);
        anon_unknown.dwarf_8df1c::FunctionLookupChain::next
                  ((FunctionLookupChain *)&result_1,(FunctionLookupChain *)&functions.allocator);
      }
      ArrayView<FunctionValue>::ArrayView<32u>
                ((ArrayView<FunctionValue> *)local_438,(SmallArray<FunctionValue,_32U> *)local_3e0);
      IntrusiveList<TypeHandle>::IntrusiveList(&local_448);
      uStack_450 = CONCAT44(arguments_local.data._4_4_,(uint)arguments_local.data);
      local_458 = ctx_local;
      generics_00.tail = local_448.tail;
      generics_00.head = local_448.head;
      arguments_00._8_8_ = uStack_450;
      arguments_00.data = (ArgumentData *)ctx_local;
      functions_01._12_4_ = 0;
      functions_01.data = (FunctionValue *)local_438._0_8_;
      functions_01.count = local_438._8_4_;
      local_428 = CreateFunctionCallFinal
                            ((ExpressionContext *)pSVar2,pSVar1,(ExprBase *)0x0,functions_01,
                             generics_00,arguments_00,true);
      if (local_428 != (ExprBase *)0x0) {
        name_local.end = (char *)local_428;
      }
      overloads_1._4_4_ = (uint)(local_428 != (ExprBase *)0x0);
      SmallArray<FunctionValue,_32U>::~SmallArray((SmallArray<FunctionValue,_32U> *)local_3e0);
      if (overloads_1._4_4_ != 0) {
        return (ExprBase *)name_local.end;
      }
    }
  }
  else {
    IntrusiveList<SynIdentifier>::IntrusiveList(&local_478);
    name_00.end = end;
    name_00.begin = (char *)arguments_local._8_8_;
    local_468 = CreateVariableAccess(ctx,source,local_478,name_00,(bool)(nextType._6_1_ & 1));
    if ((local_468 != (ExprBase *)0x0) &&
       (arguments_04.count = (uint)arguments_local.data,
       arguments_04.data = (ArgumentData *)ctx_local, arguments_04._12_4_ = 0,
       pEVar5 = CreateFunctionCall((ExpressionContext *)source_local,pSStack_58,local_468,
                                   arguments_04,(bool)(nextType._7_1_ & 1)),
       pEVar5 != (ExprBase *)0x0)) {
      return pEVar5;
    }
  }
  if ((nextType._7_1_ & 1) == 0) {
    IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)&functions_1.count);
    ArrayView<FunctionValue>::ArrayView((ArrayView<FunctionValue> *)&ratings.count);
    ArrayView<unsigned_int>::ArrayView((ArrayView<unsigned_int> *)&messageStart);
    if ((*(long *)&source_local[0x21b].typeID != 0) && (*(int *)&source_local[0x21b].begin != 0)) {
      if (*(int *)&source_local[0x21b]._vptr_SynBase == 0) {
        *(char **)&source_local[0x21a].listed = (pSStack_58->pos).begin;
        source_local[0x21b].end = *(Lexeme **)&source_local[0x21b].typeID;
      }
      messageStart_00 = source_local[0x21b].end;
      NULLC::SafeSprintf((char *)source_local[0x21b].end,
                         (ulong)(uint)(*(int *)&source_local[0x21b].begin -
                                      ((int)source_local[0x21b].end -
                                      (int)*(undefined8 *)&source_local[0x21b].typeID)),
                         "ERROR: can\'t find function \'%.*s\' with following arguments:\n",
                         (ulong)((int)name.end - arguments_local.count),arguments_local._8_8_);
      sVar7 = strlen((char *)source_local[0x21b].end);
      source_local[0x21b].end = (Lexeme *)((long)&(source_local[0x21b].end)->type + sVar7);
      arguments_01._12_4_ = arguments_local.data._4_4_;
      arguments_01.count = (uint)arguments_local.data;
      errorArguments.tail = (ExprBase *)messageStart;
      functionName.end = end;
      functionName.begin = (char *)arguments_local._8_8_;
      functions_00._8_8_ = functions_1.data;
      functions_00.data = (FunctionValue *)ratings._8_8_;
      generics_01.tail = generics.head;
      generics_01.head = (TypeHandle *)functions_1._8_8_;
      arguments_01.data = (ArgumentData *)ctx_local;
      ratings_00._8_8_ = ratings.data;
      ratings_00.data = (uint *)messageStart;
      ReportOnFunctionSelectError
                ((ExpressionContext *)source_local,pSStack_58,(char *)source_local[0x21b].end,
                 *(int *)&source_local[0x21b].begin -
                 ((int)source_local[0x21b].end - (int)*(undefined8 *)&source_local[0x21b].typeID),
                 (char *)messageStart_00,functionName,functions_00,generics_01,arguments_01,
                 ratings_00,0xffffffff,true);
      sVar7 = strlen((char *)source_local[0x21b].end);
      source_local[0x21b].end = (Lexeme *)((long)&(source_local[0x21b].end)->type + sVar7);
    }
    if (((ulong)source_local[0x217].pos.end & 0x100) != 0) {
      if (((ulong)source_local[0x217].pos.end & 1) != 0) {
        longjmp((__jmp_buf_tag *)&source_local[0x217].next,1);
      }
      __assert_fail("ctx.errorHandlerActive",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1c38,
                    "ExprBase *CreateFunctionCallByName(ExpressionContext &, SynBase *, InplaceStr, ArrayView<ArgumentData>, bool, bool, bool)"
                   );
    }
    *(int *)&source_local[0x21b]._vptr_SynBase = *(int *)&source_local[0x21b]._vptr_SynBase + 1;
    IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)auStack_538);
    for (local_53c = 0; uVar3 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&ctx_local)
        , local_53c < uVar3; local_53c = local_53c + 1) {
      this = ExpressionContext::get<ExprPassthrough>((ExpressionContext *)source_local);
      pAVar8 = ArrayView<ArgumentData>::operator[]((ArrayView<ArgumentData> *)&ctx_local,local_53c);
      pSVar1 = pAVar8->value->source;
      pAVar8 = ArrayView<ArgumentData>::operator[]((ArrayView<ArgumentData> *)&ctx_local,local_53c);
      pTVar9 = pAVar8->value->type;
      pAVar8 = ArrayView<ArgumentData>::operator[]((ArrayView<ArgumentData> *)&ctx_local,local_53c);
      ExprPassthrough::ExprPassthrough(this,pSVar1,pTVar9,pAVar8->value);
      IntrusiveList<ExprBase>::push_back
                ((IntrusiveList<ExprBase> *)auStack_538,&this->super_ExprBase);
    }
    name_local.end =
         (char *)ExpressionContext::get<ExprFunctionCall>((ExpressionContext *)source_local);
    pSVar1 = pSStack_58;
    pTVar9 = &ExpressionContext::GetErrorType((ExpressionContext *)source_local)->super_TypeBase;
    this_00 = ExpressionContext::get<ExprError>((ExpressionContext *)source_local);
    pSVar2 = pSStack_58;
    type = &ExpressionContext::GetErrorType((ExpressionContext *)source_local)->super_TypeBase;
    ExprError::ExprError(this_00,pSVar2,type);
    arguments_02.tail = errorArguments.head;
    arguments_02.head = _auStack_538;
    ExprFunctionCall::ExprFunctionCall
              ((ExprFunctionCall *)name_local.end,pSVar1,pTVar9,&this_00->super_ExprBase,
               arguments_02);
  }
  else {
    name_local.end = (char *)0x0;
  }
  return (ExprBase *)name_local.end;
}

Assistant:

ExprBase* CreateFunctionCallByName(ExpressionContext &ctx, SynBase *source, InplaceStr name, ArrayView<ArgumentData> arguments, bool allowFailure, bool allowInternal, bool allowFastLookup)
{
	if(allowFastLookup)
	{
		if(TypeBase *nextType = FindNextTypeFromScope(ctx.scope))
		{
			unsigned hash = nextType->nameHash;

			hash = NULLC::StringHashContinue(hash, "::");
			hash = NULLC::StringHashContinue(hash, name.begin, name.end);

			if(LookupFunctionByName(ctx, hash))
			{
				if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), name, allowInternal))
				{
					if(ExprBase *result = CreateFunctionCall(ctx, source, overloads, arguments, allowFailure))
						return result;
				}
			}
		}

		if(FunctionLookupChain function = LookupFunctionChainByName(ctx, name.hash()))
		{
			// Collect a set of available functions
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			while(function)
			{
				functions.push_back(FunctionValue(source, *function, CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), *function)));

				function = function.next();
			}

			if(ExprBase *result = CreateFunctionCallFinal(ctx, source, NULL, functions, IntrusiveList<TypeHandle>(), arguments, true))
				return result;
		}
	}
	else
	{
		if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), name, allowInternal))
		{
			if(ExprBase *result = CreateFunctionCall(ctx, source, overloads, arguments, allowFailure))
				return result;
		}
	}

	if(!allowFailure)
	{
		IntrusiveList<TypeHandle> generics;
		ArrayView<FunctionValue> functions;
		ArrayView<unsigned> ratings;

		if(ctx.errorBuf && ctx.errorBufSize)
		{
			if(ctx.errorCount == 0)
			{
				ctx.errorPos = source->pos.begin;
				ctx.errorBufLocation = ctx.errorBuf;
			}

			const char *messageStart = ctx.errorBufLocation;

			NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: can't find function '%.*s' with following arguments:\n", FMT_ISTR(name));

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			ReportOnFunctionSelectError(ctx, source, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), messageStart, name, functions, generics, arguments, ratings, ~0u, true);

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);
		}

		if(ctx.errorHandlerNested)
		{
			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}

		ctx.errorCount++;

		IntrusiveList<ExprBase> errorArguments;

		for(unsigned i = 0; i < arguments.size(); i++)
			errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

		return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType()), errorArguments);
	}

	return NULL;
}